

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.hpp
# Opt level: O2

extent<pstore::repo::compilation>
pstore::repo::compilation::
alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
          (transaction<std::unique_lock<mock_mutex>_> *transaction,
          typed_address<pstore::indirect_string> triple,
          __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
          first_member,
          __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
          last_member)

{
  ulong uVar1;
  ulong uVar2;
  typed_address<pstore::repo::compilation> size;
  compilation *this;
  uint64_t uVar3;
  extent<pstore::repo::compilation> eVar4;
  shared_ptr<pstore::repo::compilation> ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined4 extraout_var;
  
  uVar2 = ((long)last_member._M_current - (long)first_member._M_current) / 0x30;
  if ((long)last_member._M_current - (long)first_member._M_current < -0x2f) {
    assert_failed("dist >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                  ,0x11e);
  }
  if (uVar2 >> 0x20 == 0) {
    uVar1 = 1;
    if (1 < (uint)uVar2) {
      uVar1 = uVar2;
    }
    uVar3 = (uVar1 & 0xffffffff) * 0x30 + 0x20;
    size.a_.a_._0_4_ =
         (*(transaction->super_transaction_base)._vptr_transaction_base[2])(transaction,uVar3,0x10);
    size.a_.a_._4_4_ = extraout_var;
    transaction_base::getrw
              ((transaction_base *)&stack0xffffffffffffffc0,(address)transaction,(size_t)size.a_.a_)
    ;
    std::static_pointer_cast<pstore::repo::compilation,void>((shared_ptr<void> *)&ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    this = (compilation *)
           operator_new(0x50,ptr.
                             super___shared_ptr<pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    compilation<__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
              (this,triple,(uint)uVar2,first_member,last_member);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptr.super___shared_ptr<pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    eVar4.size = uVar3;
    eVar4.addr.a_.a_ = size.a_.a_;
    return eVar4;
  }
  raise<pstore::repo::error_code>(too_many_members_in_compilation);
}

Assistant:

auto compilation::alloc (TransactionType & transaction,
                                 typed_address<indirect_string> triple, Iterator first_member,
                                 Iterator last_member) -> extent<compilation> {
            // First work out its size.
            auto const dist = std::distance (first_member, last_member);
            PSTORE_ASSERT (dist >= 0);

            if (dist > std::numeric_limits<size_type>::max ()) {
                raise (error_code::too_many_members_in_compilation);
            }

            auto const num_members = static_cast<size_type> (dist);
            auto const size = size_bytes (num_members);

            // Allocate the storage.
            auto const addr = transaction.allocate (size, alignof (compilation));
            auto ptr = std::static_pointer_cast<compilation> (transaction.getrw (addr, size));

            // Write the data to the store.
            new (ptr.get ()) compilation{triple, num_members, first_member, last_member};
            return extent<compilation> (typed_address<compilation> (addr), size);
        }